

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O1

string * validateName(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  char buf [5];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      cVar1 = pcVar3[sVar5];
      iVar4 = isalnum((int)cVar1);
      if (((cVar1 == 0x5f) || (iVar4 != 0)) || (cVar1 == '.')) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string validateName(const std::string &str) {
	std::string out;
	for (const auto &c: str) {
		if (isalnum(c) || c == '_') {
			out += c;
		} else if(c == '.') {
			out += '_';
		} else {
			char buf[5] = "_xx_";
			buf[1] = ((c>>4)&0xf)["0123456789ABCDEF"];
			buf[2] = (c&0xf)["0123456789ABCDEF"];
			out += buf;
		}
	}

	return out;
}